

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnixienumber.cpp
# Opt level: O1

void __thiscall QNixieNumber::paintEvent(QNixieNumber *this,QPaintEvent *param_1)

{
  long lVar1;
  QPainter paint;
  undefined1 local_40 [8];
  double local_38;
  undefined8 local_30;
  
  QPainter::QPainter((QPainter *)local_40,(QPaintDevice *)&this->field_0x10);
  if ((this->selectMode_ == NIXIE) && (0 < this->segment_)) {
    lVar1 = 0;
    do {
      local_38 = (double)(this->width_ * (int)lVar1);
      local_30 = 0;
      QPainter::drawPixmap((QPointF *)local_40,(QPixmap *)&local_38);
      lVar1 = lVar1 + 1;
    } while (lVar1 < this->segment_);
  }
  if ((this->selectMode_ == REALNIXIE) && (0 < this->segment_)) {
    lVar1 = 0;
    do {
      local_38 = (double)(this->width_ * (int)lVar1);
      local_30 = 0;
      QPainter::drawPixmap((QPointF *)local_40,(QPixmap *)&local_38);
      lVar1 = lVar1 + 1;
    } while (lVar1 < this->segment_);
  }
  QWidget::update();
  QPainter::~QPainter((QPainter *)local_40);
  return;
}

Assistant:

void QNixieNumber::paintEvent(QPaintEvent *)
{
    QPainter paint(this);

    /* Based on the selected style, images (numbers) are drawn from the array */
    if(selectMode_ == NIXIE)
        for(int i = 0; i < segment_ ; ++i)
            paint.drawPixmap(width_ * i,0, NixieNumber[number[i]]);

    if(selectMode_ == REALNIXIE)
        for(int i = 0; i < segment_ ; ++i)
            paint.drawPixmap(width_ * i,0, RealNixieNumber[number[i]]);

    QNixieNumber::update();                                      // Automatic redrawing
}